

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void isDate(char *attrName,char *str)

{
  uint uVar1;
  size_t sVar2;
  int i;
  uint uVar3;
  long lVar4;
  int i_1;
  uint uVar5;
  uint extraout_EDX;
  uint uVar6;
  uint uVar7;
  int i_4;
  uint uVar8;
  int i_5;
  
  sVar2 = strlen(str);
  if ((((sVar2 == 0x13) && (str[4] == ':')) && (str[7] == ':')) &&
     (((str[10] == ' ' && (str[0xd] == ':')) && (str[0x10] == ':')))) {
    lVar4 = 0;
    uVar1 = 0;
    do {
      if ((byte)(str[lVar4] - 0x3aU) < 0xf6) {
        uVar1 = 0xffffffff;
        break;
      }
      uVar1 = (uint)(byte)(str[lVar4] - 0x30) + uVar1 * 10;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 4);
    lVar4 = 0;
    uVar3 = 0;
    do {
      if ((byte)(str[lVar4 + 5] - 0x3aU) < 0xf6) {
        uVar3 = 0xffffffff;
        break;
      }
      uVar3 = (uint)(byte)(str[lVar4 + 5] - 0x30) + uVar3 * 10;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 2);
    lVar4 = 0;
    uVar5 = 0;
    do {
      if ((byte)(str[lVar4 + 8] - 0x3aU) < 0xf6) {
        uVar5 = 0xffffffff;
        break;
      }
      uVar5 = (uint)(byte)(str[lVar4 + 8] - 0x30) + uVar5 * 10;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 2);
    lVar4 = 0;
    uVar6 = 0;
    do {
      if ((byte)(str[lVar4 + 0xb] - 0x3aU) < 0xf6) {
        uVar6 = 0xffffffff;
        break;
      }
      uVar6 = (uint)(byte)(str[lVar4 + 0xb] - 0x30) + uVar6 * 10;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 2);
    lVar4 = 0;
    uVar7 = 0;
    do {
      if ((byte)(str[lVar4 + 0xe] - 0x3aU) < 0xf6) {
        uVar7 = 0xffffffff;
        break;
      }
      uVar7 = (uint)(byte)(str[lVar4 + 0xe] - 0x30) + uVar7 * 10;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 2);
    lVar4 = 0;
    uVar8 = 0;
    do {
      if ((byte)(str[lVar4 + 0x11] - 0x3aU) < 0xf6) {
        uVar8 = 0xffffffff;
        break;
      }
      uVar8 = (uint)(byte)(str[lVar4 + 0x11] - 0x30) + uVar8 * 10;
      lVar4 = lVar4 + 1;
    } while (lVar4 != 2);
    if (((-1 < (int)uVar1) && (0xfffffff3 < uVar3 - 0xd)) &&
       ((0 < (int)uVar5 && (((uVar6 < 0x18 && (uVar7 < 0x3c)) && (uVar8 < 0x3c)))))) {
      if (0xb < uVar3) goto LAB_00103deb;
      if ((0xa50U >> (uVar3 & 0x1f) & 1) == 0) {
        if (uVar3 != 2) goto LAB_00103deb;
        uVar3 = 0x1c;
        if ((uVar1 & 3) == 0) {
          uVar3 = 0x1d;
          if ((uVar1 * -0x3d70a3d7 >> 2 | uVar1 * 0x40000000) < 0x28f5c29) {
            uVar3 = ((uVar1 * -0x3d70a3d7 >> 4 | uVar1 * -0x70000000) < 0xa3d70b) + 0x1c;
          }
        }
        if (uVar5 <= uVar3) {
          return;
        }
      }
      else if (uVar5 < 0x1f) {
        return;
      }
    }
  }
  do {
    notValidDate(attrName);
    uVar5 = extraout_EDX;
LAB_00103deb:
  } while (0x1f < uVar5);
  return;
}

Assistant:

void
isDate (const char attrName[], const char str[])
{
    //
    // Check that str represents a valid
    // date of the form YYYY:MM:DD hh:mm:ss.
    //

    if (strlen (str) != 19 || str[4] != ':' || str[7] != ':' ||
        str[10] != ' ' || str[13] != ':' || str[16] != ':')
    {
        notValidDate (attrName);
    }

    int Y = strToInt (str + 0, 4);  // year
    int M = strToInt (str + 5, 2);  // month
    int D = strToInt (str + 8, 2);  // day
    int h = strToInt (str + 11, 2); // hour
    int m = strToInt (str + 14, 2); // minute
    int s = strToInt (str + 17, 2); // second

    if (Y < 0 || M < 1 || M > 12 || D < 1 || h < 0 || h > 23 || m < 0 ||
        m > 59 || s < 0 || s > 59)
    {
        notValidDate (attrName);
    }

    if (M == 2)
    {
        bool leapYear = (Y % 4 == 0) && (Y % 100 != 0 || Y % 400 == 0);

        if (D > (leapYear ? 29 : 28)) notValidDate (attrName);
    }
    else if (M == 4 || M == 6 || M == 9 || M == 11)
    {
        if (D > 30) notValidDate (attrName);
    }
    else
    {
        if (D > 31) notValidDate (attrName);
    }
}